

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O2

int Div_FindDiv(Vec_Int_t *vA,Vec_Int_t *vB,int *pLitsA,int *pLitsB)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  
  piVar8 = vA->pArray;
  piVar2 = piVar8 + vA->nSize;
  piVar7 = vB->pArray;
  iVar6 = vB->nSize;
  pLitsB[0] = -1;
  pLitsB[1] = -1;
  piVar3 = piVar7 + iVar6;
  pLitsA[0] = -1;
  pLitsA[1] = -1;
  piVar1 = pLitsB + 1;
  piVar9 = pLitsA + 1;
  iVar6 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        if ((piVar2 <= piVar8) || (piVar3 <= piVar7)) {
          while( true ) {
            if (piVar2 <= piVar8) {
              while( true ) {
                if (piVar3 <= piVar7) {
                  return iVar6;
                }
                iVar4 = *piVar7;
                piVar9 = pLitsB;
                if ((*pLitsB != -1) && (piVar9 = piVar1, *piVar1 != -1)) break;
                piVar7 = piVar7 + 1;
                *piVar9 = iVar4;
              }
              return -1;
            }
            iVar4 = *piVar8;
            piVar10 = pLitsA;
            if ((*pLitsA != -1) && (piVar10 = piVar9, *piVar9 != -1)) break;
            piVar8 = piVar8 + 1;
            *piVar10 = iVar4;
          }
          return -1;
        }
        iVar4 = *piVar8;
        iVar5 = *piVar7;
        if (iVar4 != iVar5) break;
        piVar8 = piVar8 + 1;
        piVar7 = piVar7 + 1;
        iVar6 = iVar6 + 1;
      }
      if (iVar5 <= iVar4) break;
      piVar10 = pLitsA;
      if ((*pLitsA != -1) && (piVar10 = piVar9, *piVar9 != -1)) {
        return -1;
      }
      piVar8 = piVar8 + 1;
      *piVar10 = iVar4;
    }
    piVar10 = pLitsB;
    if ((*pLitsB != -1) && (piVar10 = piVar1, *piVar1 != -1)) break;
    piVar7 = piVar7 + 1;
    *piVar10 = iVar5;
  }
  return -1;
}

Assistant:

int Div_FindDiv( Vec_Int_t * vA, Vec_Int_t * vB, int pLitsA[2], int pLitsB[2] )
{
    int Counter = 0;
    int * pBegA = vA->pArray, * pEndA = vA->pArray + vA->nSize;
    int * pBegB = vB->pArray, * pEndB = vB->pArray + vB->nSize; 
    pLitsA[0] = pLitsA[1] = pLitsB[0] = pLitsB[1] = -1;
    while ( pBegA < pEndA && pBegB < pEndB )
    {
        if ( *pBegA == *pBegB )
            pBegA++, pBegB++, Counter++;
        else if ( *pBegA < *pBegB )
        {
            if ( Div_AddLit( *pBegA++, pLitsA ) )
                return -1;
        }
        else  
        {
            if ( Div_AddLit( *pBegB++, pLitsB ) )
                return -1;
        }
    }
    while ( pBegA < pEndA )
        if ( Div_AddLit( *pBegA++, pLitsA ) )
            return -1;
    while ( pBegB < pEndB )
        if ( Div_AddLit( *pBegB++, pLitsB ) )
            return -1;
    return Counter;
}